

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,double,double>
               (Array<double,__1,_1,_0,__1,_1> *dst,
               Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *src,
               assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *src_local;
  Array<double,__1,_1,_0,__1,_1> *dst_local;
  
  IVar1 = MapBase<Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::rows(&src->
                  super_MapBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                );
  cols = MapBase<Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         ::cols(&src->
                 super_MapBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               );
  IVar2 = PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>);
    if (IVar2 == cols) goto LAB_001a6b2d;
  }
  PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,IVar1,cols);
LAB_001a6b2d:
  IVar2 = PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Array<double, -1, 1>, SrcXprType = Eigen::Map<const Eigen::Array<double, -1, 1>>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}